

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  uint *z;
  ulong uVar11;
  undefined1 local_68;
  uint local_67;
  undefined1 local_63;
  char local_62;
  char local_61;
  undefined1 local_60;
  char local_5f;
  char local_5e;
  undefined1 local_5d;
  DateTime x;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  z = (uint *)&local_68;
  iVar10 = isDate(context,argc,argv,&x);
  if (iVar10 == 0) {
    computeYMD(&x);
    uVar9 = -x.Y;
    if (0 < x.Y) {
      uVar9 = x.Y;
    }
    uVar11 = (ulong)uVar9;
    uVar1 = (uVar11 / 1000) % 10;
    uVar2 = ((ulong)uVar9 / 100) % 10;
    uVar3 = (uVar11 / 10) % 10;
    local_62 = (char)((long)((ulong)(uint)((int)((long)x.M / 10) >> 0x1f) << 0x20 |
                            (long)x.M / 10 & 0xffffffffU) % 10) + '0';
    local_61 = (char)(x.M % 10) + '0';
    local_5f = (char)((long)((ulong)(uint)((int)((long)x.D / 10) >> 0x1f) << 0x20 |
                            (long)x.D / 10 & 0xffffffffU) % 10) + '0';
    local_5e = (char)(x.D % 10) + '0';
    uVar8 = (ushort)uVar1;
    bVar4 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar1 - (0xff < uVar8);
    uVar8 = (ushort)uVar2;
    bVar5 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar2 - (0xff < uVar8);
    uVar8 = (ushort)uVar3;
    bVar6 = (uVar8 != 0) * (uVar8 < 0x100) * (char)uVar3 - (0xff < uVar8);
    uVar8 = (ushort)(uVar11 % 10);
    bVar7 = (uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar11 % 10) - (0xff < uVar8);
    local_67 = CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                        CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                 CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                          (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))))
               | (uint)DAT_001e0e40;
    local_63 = 0x2d;
    local_60 = 0x2d;
    local_5d = 0;
    if (x.Y < 0) {
      local_68 = 0x2d;
      iVar10 = 0xb;
    }
    else {
      z = &local_67;
      iVar10 = 10;
    }
    sqlite3_result_text(context,(char *)z,iVar10,(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int Y;
    char zBuf[16];
    computeYMD(&x);
    Y = x.Y;
    if( Y<0 ) Y = -Y;
    zBuf[1] = '0' + (Y/1000)%10;
    zBuf[2] = '0' + (Y/100)%10;
    zBuf[3] = '0' + (Y/10)%10;
    zBuf[4] = '0' + (Y)%10;
    zBuf[5] = '-';
    zBuf[6] = '0' + (x.M/10)%10;
    zBuf[7] = '0' + (x.M)%10;
    zBuf[8] = '-';
    zBuf[9] = '0' + (x.D/10)%10;
    zBuf[10] = '0' + (x.D)%10;
    zBuf[11] = 0;
    if( x.Y<0 ){
      zBuf[0] = '-';
      sqlite3_result_text(context, zBuf, 11, SQLITE_TRANSIENT);
    }else{
      sqlite3_result_text(context, &zBuf[1], 10, SQLITE_TRANSIENT);
    }
  }
}